

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_of(void **param_1)

{
  roaring64_bitmap_t *b;
  char *in_RDI;
  anon_class_1_0_00000001 *unaff_retaddr;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000080;
  int in_stack_ffffffffffffffec;
  
  b = test_of::anon_class_1_0_00000001::operator()(unaff_retaddr);
  assert_r64_valid(b);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r,(uint64_t)unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r,(uint64_t)unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r,(uint64_t)unaff_retaddr);
  _assert_true((unsigned_long)unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_of) {
    roaring64_bitmap_t* r = roaring64_bitmap_from(1, 20000, 500000);
    assert_r64_valid(r);
    assert_true(roaring64_bitmap_contains(r, 1));
    assert_true(roaring64_bitmap_contains(r, 20000));
    assert_true(roaring64_bitmap_contains(r, 500000));
    roaring64_bitmap_free(r);
}